

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChConvexDecompositionHACD::AddTriangleMesh
          (ChConvexDecompositionHACD *this,ChTriangleMesh *tm)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  
  uVar3 = 0;
  do {
    iVar1 = (*(tm->super_ChGeometry)._vptr_ChGeometry[0xd])(tm);
    iVar4 = (int)uVar3;
    if (iVar1 <= iVar4) break;
    (*(tm->super_ChGeometry)._vptr_ChGeometry[0xe])(local_80,tm,uVar3);
    iVar2 = (*(this->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[3])
                      (this,local_78,local_60,local_48);
    uVar3 = (ulong)(iVar4 + 1);
  } while ((char)iVar2 != '\0');
  return iVar1 <= iVar4;
}

Assistant:

bool ChConvexDecompositionHACD::AddTriangleMesh(const geometry::ChTriangleMesh& tm) {
    for (int i = 0; i < tm.getNumTriangles(); i++) {
        if (!this->ChConvexDecomposition::AddTriangle(tm.getTriangle(i)))
            return false;
    }
    return true;
}